

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void __thiscall
duckdb::CreateSortKeyHelpers::DecodeSortKey
          (CreateSortKeyHelpers *this,string_t sort_key,DataChunk *result,idx_t result_idx,
          vector<duckdb::OrderModifiers,_true> *modifiers)

{
  OrderModifiers modifiers_00;
  reference result_00;
  const_reference pvVar1;
  vector<duckdb::Vector,_true> *this_00;
  ulong __n;
  DecodeSortKeyData decode_data;
  DecodeSortKeyVectorData vector_data;
  string_t sort_key_local;
  
  this_00 = sort_key.value._8_8_;
  sort_key_local.value.pointer.ptr = (char *)sort_key.value._0_8_;
  decode_data.data = (const_data_ptr_t)sort_key_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    decode_data.data = (const_data_ptr_t)sort_key_local.value.pointer.prefix;
  }
  decode_data.size = (ulong)this & 0xffffffff;
  decode_data.position = 0;
  sort_key_local.value._0_8_ = this;
  for (__n = 0; __n < (ulong)(((long)(this_00->
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    result_00 = vector<duckdb::Vector,_true>::get<true>(this_00,__n);
    pvVar1 = vector<duckdb::OrderModifiers,_true>::get<true>
                       ((vector<duckdb::OrderModifiers,_true> *)result_idx,__n);
    modifiers_00.order_type = pvVar1->order_type;
    modifiers_00.null_type = pvVar1->null_type;
    DecodeSortKeyVectorData::DecodeSortKeyVectorData(&vector_data,&result_00->type,modifiers_00);
    DecodeSortKeyRecursive(&decode_data,&vector_data,result_00,(idx_t)result);
    ::std::vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
    ::~vector(&vector_data.child_data.
               super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
             );
  }
  return;
}

Assistant:

void CreateSortKeyHelpers::DecodeSortKey(string_t sort_key, DataChunk &result, idx_t result_idx,
                                         const vector<OrderModifiers> &modifiers) {
	DecodeSortKeyData decode_data(sort_key);
	D_ASSERT(modifiers.size() == result.ColumnCount());
	for (idx_t c = 0; c < result.ColumnCount(); c++) {
		auto &vec = result.data[c];
		DecodeSortKeyVectorData vector_data(vec.GetType(), modifiers[c]);
		DecodeSortKeyRecursive(decode_data, vector_data, vec, result_idx);
	}
}